

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

Pafs * kj::anon_unknown_0::makeCompletionCountingPafs
                 (Pafs *__return_storage_ptr__,uint count,uint *tasksCompleted)

{
  undefined8 *puVar1;
  PromiseArena *pPVar2;
  OwnPromiseNode node;
  PromiseArenaMember *pPVar3;
  Promise<void> *pPVar4;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *pOVar5;
  WeakFulfiller<void> *params;
  void *pvVar6;
  long lVar7;
  undefined4 in_register_00000034;
  TransformPromiseNodeBase *this;
  long lVar8;
  PromiseFulfillerPair<void> paf;
  OwnPromiseNode local_98;
  WeakFulfillerBase *local_90;
  WeakFulfiller<void> *pWStack_88;
  Pafs *local_80;
  PromiseArenaMember *local_78;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_70;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_68;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_60;
  undefined8 *local_58;
  Promise<void> *local_50;
  Promise<void> *local_48;
  Promise<void> *local_40;
  undefined8 *local_38;
  
  local_80 = __return_storage_ptr__;
  pPVar4 = (Promise<void> *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,0,5,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_40 = pPVar4 + 5;
  local_38 = &kj::_::HeapArrayDisposer::instance;
  local_50 = pPVar4;
  local_48 = pPVar4;
  pOVar5 = (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x10,0,5,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_60 = pOVar5 + 5;
  local_58 = &kj::_::HeapArrayDisposer::instance;
  lVar7 = 0;
  lVar8 = 0;
  local_70 = pOVar5;
  local_68 = pOVar5;
  do {
    params = (WeakFulfiller<void> *)operator_new(0x18);
    (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
    (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
         (_func_int **)&PTR_reject_00605058;
    (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
         (_func_int **)&PTR_disposeImpl_00605090;
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
              ((PromiseDisposer *)&local_78,params);
    pPVar3 = local_78;
    local_98.ptr = (PromiseNode *)local_78;
    pPVar2 = local_78->arena;
    local_90 = &params->super_WeakFulfillerBase;
    pWStack_88 = params;
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_78 - (long)pPVar2) < 0x28) {
      pvVar6 = operator_new(0x400);
      this = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this,&local_98,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:838:42)>
                 ::anon_class_8_1_78461c9b_for_func::operator());
      *(undefined ***)((long)pvVar6 + 0x3d8) = &PTR_destroy_00602ef8;
      *(PromiseArena **)((long)pvVar6 + 0x3f8) =
           (PromiseArena *)CONCAT44(in_register_00000034,count);
      *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
    }
    else {
      local_78->arena = (PromiseArena *)0x0;
      this = (TransformPromiseNodeBase *)&local_78[-3].arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this,&local_98,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:838:42)>
                 ::anon_class_8_1_78461c9b_for_func::operator());
      pPVar3[-3].arena = (PromiseArena *)&PTR_destroy_00602ef8;
      pPVar3[-1].arena = (PromiseArena *)CONCAT44(in_register_00000034,count);
      pPVar3[-2]._vptr_PromiseArenaMember = (_func_int **)pPVar2;
    }
    node.ptr = local_98.ptr;
    *(TransformPromiseNodeBase **)((long)&(pPVar4->super_PromiseBase).node.ptr + lVar8) = this;
    local_48 = (Promise<void> *)((long)&pPVar4[1].super_PromiseBase.node.ptr + lVar8);
    puVar1 = (undefined8 *)((long)&pOVar5->disposer + lVar8 * 2);
    *puVar1 = local_90;
    puVar1[1] = pWStack_88;
    pWStack_88 = (WeakFulfiller<void> *)0x0;
    local_68 = (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)
               ((long)&pOVar5[1].disposer + lVar7);
    if (&(local_98.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_98.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
    }
    lVar8 = lVar8 + 8;
    lVar7 = lVar7 + 0x10;
  } while ((int)lVar8 != 0x28);
  (local_80->promises).ptr = pPVar4;
  (local_80->promises).size_ = lVar8 >> 3;
  (local_80->promises).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  (local_80->fulfillers).ptr = pOVar5;
  (local_80->fulfillers).size_ = lVar7 >> 4;
  (local_80->fulfillers).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return local_80;
}

Assistant:

Pafs makeCompletionCountingPafs(uint count, uint& tasksCompleted) {
  auto promisesBuilder = heapArrayBuilder<Promise<void>>(count);
  auto fulfillersBuilder = heapArrayBuilder<Own<PromiseFulfiller<void>>>(count);

  for (auto KJ_UNUSED value: zeroTo(count)) {
    auto paf = newPromiseAndFulfiller<void>();
    promisesBuilder.add(paf.promise.then([&tasksCompleted]() {
      ++tasksCompleted;
    }));
    fulfillersBuilder.add(kj::mv(paf.fulfiller));
  }

  return { promisesBuilder.finish(), fulfillersBuilder.finish() };
}